

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_socket_get_send_poll_fd(nng_socket id,int *fdp)

{
  nni_sock *local_28;
  nni_sock *sock;
  int *piStack_18;
  int rv;
  int *fdp_local;
  nng_socket id_local;
  
  piStack_18 = fdp;
  fdp_local._0_4_ = id.id;
  sock._4_4_ = nni_sock_find(&local_28,id.id);
  fdp_local._4_4_ = sock._4_4_;
  if (sock._4_4_ == 0) {
    sock._4_4_ = nni_sock_get_send_fd(local_28,piStack_18);
    nni_sock_rele(local_28);
    fdp_local._4_4_ = sock._4_4_;
  }
  return fdp_local._4_4_;
}

Assistant:

int
nng_socket_get_send_poll_fd(nng_socket id, int *fdp)
{
	int       rv;
	nni_sock *sock;

	if ((rv = nni_sock_find(&sock, id.id)) != 0) {
		return (rv);
	}

	rv = nni_sock_get_send_fd(sock, fdp);
	nni_sock_rele(sock);
	return (rv);
}